

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls.cpp
# Opt level: O2

bool __thiscall QDtls::abortHandshake(QDtls *this,QUdpSocket *socket)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  long in_FS_OFFSET;
  undefined8 uStack_50;
  QArrayDataPointer<char16_t> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)(*(long *)&this->field_0x8 + 0x78);
  if (plVar1 == (long *)0x0) {
    bVar5 = false;
    goto LAB_0023a290;
  }
  if (socket == (QUdpSocket *)0x0) {
    lVar2 = *(long *)(*plVar1 + -0x60);
    tr((QString *)&QStack_48,"Invalid (nullptr) socket",(char *)0x0,-1);
    lVar4 = *(long *)((long)plVar1 + lVar2);
    uStack_50 = 1;
LAB_0023a27e:
    bVar5 = false;
    (**(code **)(lVar4 + 0x10))((long)plVar1 + lVar2,uStack_50,&QStack_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  }
  else {
    iVar3 = (**(code **)(*plVar1 + 0x90))(plVar1);
    if (iVar3 != 2) {
      iVar3 = (**(code **)(*plVar1 + 0x90))(plVar1);
      if (iVar3 != 1) {
        lVar2 = *(long *)(*plVar1 + -0x60);
        tr((QString *)&QStack_48,"No handshake in progress, nothing to abort",(char *)0x0,-1);
        lVar4 = *(long *)((long)plVar1 + lVar2);
        uStack_50 = 2;
        goto LAB_0023a27e;
      }
    }
    (**(code **)(*plVar1 + 0xc0))(plVar1,socket);
    bVar5 = true;
  }
LAB_0023a290:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QDtls::abortHandshake(QUdpSocket *socket)
{
    Q_D(QDtls);

    auto *backend = d->backend.get();
    if (!backend)
        return false;

    if (!socket) {
        backend->setDtlsError(QDtlsError::InvalidInputParameters, tr("Invalid (nullptr) socket"));
        return false;
    }

    if (backend->state() != PeerVerificationFailed && backend->state() != HandshakeInProgress) {
        backend->setDtlsError(QDtlsError::InvalidOperation,
                              tr("No handshake in progress, nothing to abort"));
        return false;
    }

    backend->abortHandshake(socket);
    return true;
}